

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dbl.c
# Opt level: O1

void arg_dbl_errorfn(arg_dbl *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  char *pcVar1;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  pcVar1 = "";
  if (argval != (char *)0x0) {
    pcVar1 = argval;
  }
  arg_dstr_catf(ds,"%s: ",progname);
  if (errorcode == 5) {
    arg_dstr_catf(ds,"invalid argument \"%s\" to option ",pcVar1);
  }
  else if (errorcode == 2) {
    arg_dstr_cat(ds,"excess option ");
    datatype = pcVar1;
  }
  else {
    if (errorcode != 1) {
      return;
    }
    arg_dstr_cat(ds,"missing option ");
  }
  arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_dbl_errorfn(struct arg_dbl* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    /* make argval NULL safe */
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_cat(ds, "missing option ");
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_cat(ds, "excess option ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;

        case ARG_ERR_BADDOUBLE:
            arg_dstr_catf(ds, "invalid argument \"%s\" to option ", argval);
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;
    }
}